

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

string * __thiscall
t_xml_generator::number_to_string<long>(string *__return_storage_ptr__,t_xml_generator *this,long t)

{
  locale local_1a0 [8];
  long local_198;
  ostringstream out;
  long t_local;
  t_xml_generator *this_local;
  
  out._368_8_ = t;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::locale::classic();
  std::ios::imbue(local_1a0);
  std::locale::~locale(local_1a0);
  std::ios_base::precision((ios_base *)((long)&local_198 + *(long *)(local_198 + -0x18)),0x12);
  std::ostream::operator<<(&local_198,out._368_8_);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return __return_storage_ptr__;
}

Assistant:

string number_to_string(T t) {
    std::ostringstream out;
    out.imbue(std::locale::classic());
    out.precision(std::numeric_limits<T>::digits10);
    out << t;
    return out.str();
  }